

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.cpp
# Opt level: O0

void __thiscall deqp::gls::ShaderRenderCase::~ShaderRenderCase(ShaderRenderCase *this)

{
  ShaderRenderCase *this_local;
  
  ~ShaderRenderCase(this);
  operator_delete(this,0x128);
  return;
}

Assistant:

ShaderRenderCase::~ShaderRenderCase (void)
{
	ShaderRenderCase::deinit();
}